

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_compareBaseIncomparableUnitsWithInputAsNullptr_Test::TestBody
          (Units_compareBaseIncomparableUnitsWithInputAsNullptr_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u;
  long *local_78;
  AssertHelper local_70 [8];
  AssertionResult local_68;
  long local_58 [2];
  long *local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long local_38 [2];
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar1 = local_28;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"u","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"milli","");
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  libcellml::Units::addUnit((StandardUnit)local_28,(string *)0x10,1.0,1.0,(string *)&local_68);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = (long *)0x0;
  local_68.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cVar2 = libcellml::Units::compatible((shared_ptr *)&local_28,(shared_ptr *)&local_68);
  local_48 = (long *)(CONCAT71(local_48._1_7_,cVar2) ^ 1);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 != '\0') goto LAB_00139823;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.message_.ptr_);
    if (((ulong)local_48 & 1) == 0) {
LAB_00139823:
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(char *)&local_48,"libcellml::Units::compatible(u, nullptr)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                 ,0x656,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=(local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(local_70);
      if ((long *)local_68._0_8_ != local_58) {
        operator_delete((void *)local_68._0_8_,local_58[0] + 1);
      }
      if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._0_8_ = (long *)0x0;
  local_68.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cVar2 = libcellml::Units::compatible((shared_ptr *)&local_68,(shared_ptr *)&local_28);
  local_48 = (long *)(CONCAT71(local_48._1_7_,cVar2) ^ 1);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 == '\0') goto LAB_001399b5;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.message_.ptr_);
    if (((ulong)local_48 & 1) != 0) goto LAB_001399b5;
  }
  testing::Message::Message((Message *)&local_78);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_68,(char *)&local_48,"libcellml::Units::compatible(nullptr, u)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
             ,0x657,(char *)local_68._0_8_);
  testing::internal::AssertHelper::operator=(local_70,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(local_70);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_78 != (long *)0x0)) {
    (**(code **)(*local_78 + 8))();
  }
LAB_001399b5:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, compareBaseIncomparableUnitsWithInputAsNullptr)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit(libcellml::Units::StandardUnit::LUX, "milli");

    EXPECT_FALSE(libcellml::Units::compatible(u, nullptr));
    EXPECT_FALSE(libcellml::Units::compatible(nullptr, u));
}